

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_racedump(CHAR_DATA *ch,char *argument)

{
  long lVar1;
  FILE *__stream;
  char *pcVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  char buf [4608];
  char local_1238 [4616];
  
  __stream = fopen("../logs/racdump.txt","w");
  pcVar2 = (race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
            super__Vector_impl_data._M_start)->name;
  if (pcVar2 != (char *)0x0) {
    lVar3 = 0;
    uVar6 = 0;
    do {
      fprintf(__stream,";%s;%s;%s;%s;",pcVar2,pcVar2,pcVar2,pcVar2);
      fprintf(__stream," %d;",
              (ulong)race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar6].pc_race);
      lVar4 = 2;
      uVar5 = 0;
      do {
        lVar1 = *(long *)((long)(race_table.
                                 super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
                                 super__Vector_impl_data._M_start)->act + lVar4 * 8 + lVar3 + -0x10)
        ;
        if (lVar1 != -99) {
          dVar7 = exp2((double)lVar1);
          uVar5 = uVar5 | (long)dVar7;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0xc);
      fprintf(__stream," %ld;",uVar5);
      lVar4 = 0;
      uVar5 = 0;
      do {
        lVar1 = *(long *)((long)(race_table.
                                 super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
                                 super__Vector_impl_data._M_start)->aff + lVar4 * 8 + lVar3);
        if (lVar1 != -99) {
          dVar7 = exp2((double)lVar1);
          uVar5 = uVar5 | (long)dVar7;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 10);
      fprintf(__stream," %ld;",uVar5);
      lVar4 = 0;
      uVar5 = 0;
      do {
        lVar1 = *(long *)((long)(race_table.
                                 super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
                                 super__Vector_impl_data._M_start)->off + lVar4 * 8 + lVar3);
        if (lVar1 != -99) {
          dVar7 = exp2((double)lVar1);
          uVar5 = uVar5 | (long)dVar7;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 10);
      fprintf(__stream," %ld;",uVar5);
      lVar4 = 0;
      uVar5 = 0;
      do {
        lVar1 = *(long *)((long)(race_table.
                                 super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
                                 super__Vector_impl_data._M_start)->imm + lVar4 * 8 + lVar3);
        if (lVar1 != -99) {
          dVar7 = exp2((double)lVar1);
          uVar5 = uVar5 | (long)dVar7;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 10);
      fprintf(__stream," %ld;",uVar5);
      lVar4 = 0;
      uVar5 = 0;
      do {
        lVar1 = *(long *)((long)(race_table.
                                 super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
                                 super__Vector_impl_data._M_start)->res + lVar4 * 8 + lVar3);
        if (lVar1 != -99) {
          dVar7 = exp2((double)lVar1);
          uVar5 = uVar5 | (long)dVar7;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 10);
      fprintf(__stream," %ld;",uVar5);
      lVar4 = 0;
      uVar5 = 0;
      do {
        lVar1 = *(long *)((long)(race_table.
                                 super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
                                 super__Vector_impl_data._M_start)->vuln + lVar4 * 8 + lVar3);
        if (lVar1 != -99) {
          dVar7 = exp2((double)lVar1);
          uVar5 = uVar5 | (long)dVar7;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 10);
      fprintf(__stream," %ld;",uVar5);
      uVar5 = 0;
      lVar4 = 0;
      do {
        lVar1 = *(long *)((long)(race_table.
                                 super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
                                 super__Vector_impl_data._M_start)->form + uVar5 * 8 + lVar3);
        if (lVar1 < 0x1c && lVar1 != -99) {
          dVar7 = exp2((double)lVar1);
          lVar4 = lVar4 + (long)dVar7;
          dVar7 = exp2((double)*(long *)((long)(race_table.
                                                super__Vector_base<race_type,_std::allocator<race_type>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->parts +
                                        uVar5 * 8 + lVar3));
          sprintf(local_1238,"(FORM) %d-%d = %ld\n\r",uVar6 & 0xffffffff,uVar5 & 0xffffffff,
                  (long)dVar7);
          send_to_char(local_1238,ch);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != 0xf);
      fprintf(__stream," %ld;",lVar4);
      uVar5 = 0;
      lVar4 = 0;
      do {
        lVar1 = *(long *)((long)(race_table.
                                 super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
                                 super__Vector_impl_data._M_start)->parts + uVar5 * 8 + lVar3);
        if (lVar1 < 0x1c && lVar1 != -99) {
          dVar7 = exp2((double)lVar1);
          lVar4 = lVar4 + (long)dVar7;
          dVar7 = exp2((double)*(long *)((long)(race_table.
                                                super__Vector_base<race_type,_std::allocator<race_type>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->parts +
                                        uVar5 * 8 + lVar3));
          sprintf(local_1238,"(PARTS) %d-%d = %ld\n\r",uVar6 & 0xffffffff,uVar5 & 0xffffffff,
                  (long)dVar7);
          send_to_char(local_1238,ch);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != 0xf);
      fprintf(__stream," %ld;",lVar4);
      fprintf(__stream," %d; %d; 0; 0; 0; 0; 0; 25; 25; 25; 25; 25;\n",
              (ulong)(uint)race_table.super__Vector_base<race_type,_std::allocator<race_type>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar6].arms,
              (ulong)(uint)race_table.super__Vector_base<race_type,_std::allocator<race_type>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar6].legs);
      pcVar2 = race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
               super__Vector_impl_data._M_start[uVar6 + 1].name;
      lVar3 = lVar3 + 0x2e8;
      uVar6 = uVar6 + 1;
    } while (pcVar2 != (char *)0x0);
  }
  fclose(__stream);
  return;
}

Assistant:

void do_racedump(CHAR_DATA *ch, char *argument)
{
	FILE *fp = fopen(RACE_DUMP_FILE, "w");
	int race = 0, i = 0;
	long temp_bit = 0;
	char buf[MSL];

	for (race = 0; race_table[race].name != nullptr; race++)
	{
		fprintf(fp, ";%s;%s;%s;%s;", race_table[race].name, race_table[race].name, race_table[race].name, race_table[race].name);
		fprintf(fp, " %d;", race_table[race].pc_race);

		temp_bit = 0;

		for (i = 0; i < 10; i++)
		{
			if (race_table[race].act[i] != NO_FLAG)
				SET_BIT_OLD(temp_bit, race_table[race].act[i]);
		}

		fprintf(fp, " %ld;", temp_bit);
		temp_bit = 0;

		for (i = 0; i < 10; i++)
		{
			if (race_table[race].aff[i] != NO_FLAG)
				SET_BIT_OLD(temp_bit, race_table[race].aff[i]);
		}

		fprintf(fp, " %ld;", temp_bit);
		temp_bit = 0;

		for (i = 0; i < 10; i++)
		{
			if (race_table[race].off[i] != NO_FLAG)
				SET_BIT_OLD(temp_bit, race_table[race].off[i]);
		}

		fprintf(fp, " %ld;", temp_bit);
		temp_bit = 0;

		for (i = 0; i < 10; i++)
		{
			if (race_table[race].imm[i] != NO_FLAG)
				SET_BIT_OLD(temp_bit, race_table[race].imm[i]);
		}

		fprintf(fp, " %ld;", temp_bit);
		temp_bit = 0;

		for (i = 0; i < 10; i++)
		{
			if (race_table[race].res[i] != NO_FLAG)
				SET_BIT_OLD(temp_bit, race_table[race].res[i]);
		}

		fprintf(fp, " %ld;", temp_bit);
		temp_bit = 0;

		for (i = 0; i < 10; i++)
		{
			if (race_table[race].vuln[i] != NO_FLAG)
				SET_BIT_OLD(temp_bit, race_table[race].vuln[i]);
		}

		fprintf(fp, " %ld;", temp_bit);
		temp_bit = 0;

		for (i = 0; i < 15; i++)
		{
			if (race_table[race].form[i] != NO_FLAG && race_table[race].form[i] < ASCII_cc)
			{
				temp_bit += (long int)pow(2, race_table[race].form[i]);
				sprintf(buf, "(FORM) %d-%d = %ld\n\r", race, i, (long int)pow(2, race_table[race].parts[i]));
				send_to_char(buf, ch);
			}
		}

		fprintf(fp, " %ld;", temp_bit);
		temp_bit = 0;

		for (i = 0; i < 15; i++)
		{
			if (race_table[race].parts[i] != NO_FLAG && race_table[race].parts[i] < ASCII_cc)
			{
				temp_bit += (long int)pow(2, race_table[race].parts[i]);
				sprintf(buf, "(PARTS) %d-%d = %ld\n\r", race, i, (long int)pow(2, race_table[race].parts[i]));
				send_to_char(buf, ch);
			}
		}

		fprintf(fp, " %ld;", temp_bit);
		fprintf(fp, " %d; %d; 0; 0; 0; 0; 0; 25; 25; 25; 25; 25;\n", race_table[race].arms, race_table[race].legs);
	}

	fclose(fp);
}